

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O3

double HTS_b2en(HTS_Vocoder *v,double *b,int m,double a)

{
  long lVar1;
  double dVar2;
  double *c1;
  ulong uVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  double dVar10;
  
  c1 = v->spectrum2en_buff;
  uVar7 = (ulong)(uint)m;
  if (v->spectrum2en_size < uVar7) {
    if (c1 != (double *)0x0) {
      HTS_free(c1);
    }
    c1 = (double *)HTS_calloc((ulong)(m + 0x481),8);
    v->spectrum2en_buff = c1;
    v->spectrum2en_size = uVar7;
  }
  pdVar5 = c1 + uVar7;
  pdVar9 = c1 + uVar7 + 0x241;
  dVar10 = b[uVar7];
  *pdVar5 = dVar10;
  if (0 < m) {
    uVar3 = uVar7 + 1;
    do {
      dVar2 = b[uVar3 - 2];
      c1[uVar3 - 2] = dVar10 * a + dVar2;
      uVar3 = uVar3 - 1;
      dVar10 = dVar2;
    } while (1 < uVar3);
  }
  HTS_freqt(v,c1,m,pdVar5 + 1,0x23f,-a);
  dVar10 = exp(pdVar5[1]);
  *pdVar9 = dVar10;
  lVar4 = 1;
  pdVar5 = pdVar9;
  do {
    dVar10 = 0.0;
    pdVar6 = pdVar5;
    lVar8 = 0;
    do {
      lVar1 = lVar8 + 1;
      dVar10 = dVar10 + (double)(int)lVar1 * c1[uVar7 + lVar8 + 2] * *pdVar6;
      pdVar6 = pdVar6 + -1;
      lVar8 = lVar1;
    } while (lVar4 != lVar1);
    pdVar9[lVar4] = dVar10 / (double)(int)lVar4;
    lVar4 = lVar4 + 1;
    pdVar5 = pdVar5 + 1;
  } while (lVar4 != 0x240);
  dVar10 = 0.0;
  lVar4 = 0;
  do {
    dVar10 = dVar10 + pdVar9[lVar4] * pdVar9[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x240);
  return dVar10;
}

Assistant:

static double HTS_b2en(HTS_Vocoder * v, const double *b, const int m, const double a)
{
   int i;
   double en = 0.0;
   double *cep;
   double *ir;

   if (v->spectrum2en_size < m) {
      if (v->spectrum2en_buff != NULL)
         HTS_free(v->spectrum2en_buff);
      v->spectrum2en_buff = (double *) HTS_calloc((m + 1) + 2 * IRLENG, sizeof(double));
      v->spectrum2en_size = m;
   }
   cep = v->spectrum2en_buff + m + 1;
   ir = cep + IRLENG;

   HTS_b2mc(b, v->spectrum2en_buff, m, a);
   HTS_freqt(v, v->spectrum2en_buff, m, cep, IRLENG - 1, -a);
   HTS_c2ir(cep, IRLENG, ir, IRLENG);

   for (i = 0; i < IRLENG; i++)
      en += ir[i] * ir[i];

   return (en);
}